

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O3

void Ptex::v2_4::(anonymous_namespace)::Apply<Ptex::v2_4::PtexHalf,3>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int param_5)

{
  ushort *puVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ushort *puVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  iVar6 = k->v1;
  iVar3 = k->v2;
  if (iVar6 != iVar3) {
    fVar2 = k->A;
    do {
      iVar5 = k->rowlen - iVar6;
      iVar4 = iVar5 - k->w2;
      if (iVar4 < k->u1) {
        iVar4 = k->u1;
      }
      iVar5 = iVar5 - k->w1;
      if (k->u2 < iVar5) {
        iVar5 = k->u2;
      }
      if (0 < iVar5 - iVar4) {
        puVar7 = (ushort *)((long)data + (long)((k->rowlen * iVar6 + iVar4) * 3) * 2);
        puVar1 = puVar7 + (iVar5 - iVar4) * 3;
        fVar9 = (float)iVar4 - k->u;
        fVar8 = (float)iVar6 - k->v;
        fVar10 = fVar9 * k->A * fVar9 + (k->B * fVar9 + k->C * fVar8) * fVar8;
        fVar8 = (fVar9 + fVar9 + 1.0) * k->A + fVar8 * k->B;
        do {
          if (fVar10 < 1.0) {
            fVar9 = expf(fVar10 * -6.125);
            fVar9 = fVar9 * k->wscale;
            k->weight = k->weight + fVar9;
            *(ulong *)result =
                 CONCAT44(fVar9 * *(float *)(PtexHalf::h2fTable + (ulong)puVar7[1] * 4) +
                          (float)((ulong)*(undefined8 *)result >> 0x20),
                          fVar9 * *(float *)(PtexHalf::h2fTable + (ulong)*puVar7 * 4) +
                          (float)*(undefined8 *)result);
            result[2] = fVar9 * *(float *)(PtexHalf::h2fTable + (ulong)puVar7[2] * 4) + result[2];
          }
          fVar10 = fVar10 + fVar8;
          fVar8 = fVar8 + fVar2 + fVar2;
          puVar7 = puVar7 + 3;
        } while (puVar7 < puVar1);
        iVar3 = k->v2;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != iVar3);
  }
  return;
}

Assistant:

void Apply(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int /*nTxChan*/)
    {
        int nTxChan = nChan;
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }